

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

int64_t Assimp::FBX::ParseTokenAsInt64(Token *t)

{
  int64_t iVar1;
  char *err;
  allocator<char> local_39;
  char *local_38;
  string local_30;
  
  iVar1 = ParseTokenAsInt64(t,&local_38);
  if (local_38 == (char *)0x0) {
    return iVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,local_38,&local_39);
  anon_unknown.dwarf_e3fe61::ParseError(&local_30,t);
}

Assistant:

int64_t ParseTokenAsInt64(const Token& t)
{
    const char* err;
    const int64_t i = ParseTokenAsInt64(t, err);
    if (err) {
        ParseError(err, t);
    }
    return i;
}